

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int codebook_decode_step(vorb *f,Codebook *c,float *output,int len,int step)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  long in_RDX;
  int *in_RSI;
  int in_R8D;
  float fVar3;
  float val;
  float last;
  int z;
  int i;
  float local_34;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar4;
  int local_4;
  
  iVar2 = codebook_decode_start
                    ((vorb *)CONCAT44(in_ECX,in_R8D),
                     (Codebook *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  local_34 = 0.0;
  if (iVar2 < 0) {
    local_4 = 0;
  }
  else {
    if (*in_RSI < in_ECX) {
      in_ECX = *in_RSI;
    }
    iVar1 = *in_RSI;
    for (iVar4 = 0; iVar4 < in_ECX; iVar4 = iVar4 + 1) {
      fVar3 = *(float *)(*(long *)(in_RSI + 8) + (long)(iVar1 * iVar2 + iVar4) * 4) + local_34;
      *(float *)(in_RDX + (long)(iVar4 * in_R8D) * 4) =
           fVar3 + *(float *)(in_RDX + (long)(iVar4 * in_R8D) * 4);
      if (*(char *)((long)in_RSI + 0x1a) != '\0') {
        local_34 = fVar3;
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int codebook_decode_step(vorb *f, Codebook *c, float *output, int len, int step)
{
   int i,z = codebook_decode_start(f,c);
   float last = CODEBOOK_ELEMENT_BASE(c);
   if (z < 0) return FALSE;
   if (len > c->dimensions) len = c->dimensions;

#ifdef STB_VORBIS_DIVIDES_IN_CODEBOOK
   if (c->lookup_type == 1) {
      int div = 1;
      for (i=0; i < len; ++i) {
         int off = (z / div) % c->lookup_values;
         float val = CODEBOOK_ELEMENT_FAST(c,off) + last;
         output[i*step] += val;
         if (c->sequence_p) last = val;
         div *= c->lookup_values;
      }
      return TRUE;
   }
#endif

   z *= c->dimensions;
   for (i=0; i < len; ++i) {
      float val = CODEBOOK_ELEMENT_FAST(c,z+i) + last;
      output[i*step] += val;
      if (c->sequence_p) last = val;
   }

   return TRUE;
}